

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O3

int jpc_ppm_putparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *out)

{
  uint uVar1;
  
  uVar1 = jas_stream_write(out,(ms->parms).ppm.data,*(uint *)((long)&ms->parms + 8));
  return -(uint)((ms->parms).sot.len != (ulong)uVar1);
}

Assistant:

static int jpc_ppm_putparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *out)
{
	jpc_ppm_t *ppm = &ms->parms.ppm;

	/* Eliminate compiler warning about unused variables. */
	(void)cstate;

	if (JAS_CAST(jas_uint, jas_stream_write(out, (char *) ppm->data, ppm->len)) != ppm->len) {
		return -1;
	}
	return 0;
}